

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O1

void __thiscall Lodtalk::NativeError::~NativeError(NativeError *this)

{
  pointer pcVar1;
  
  this->super_NativeException = (NativeException)&PTR__NativeError_00164aa8;
  pcVar1 = (this->errorMessage)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->errorMessage).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception((exception *)this);
  operator_delete(this);
  return;
}

Assistant:

class LODTALK_VM_EXPORT NativeError: public NativeException
{
public:
	NativeError(const std::string &errorMessage) noexcept
		: errorMessage(errorMessage) {}

	virtual const char* what() const noexcept
	{
		return errorMessage.c_str();
	}

private:
	std::string errorMessage;
}